

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::HDWallet::HDWallet
          (HDWallet *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool use_ideographic_space)

{
  CfdException *this_00;
  string *message;
  size_t sVar1;
  undefined8 uVar2;
  ByteData *in_stack_ffffffffffffff08;
  ByteData *in_stack_ffffffffffffff10;
  allocator *paVar3;
  CfdError error_code;
  allocator local_99;
  string local_98 [32];
  ByteData local_78;
  allocator local_49;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool use_ideographic_space_local;
  string *passphrase_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *mnemonic_local;
  HDWallet *this_local;
  
  local_21 = use_ideographic_space;
  psStack_20 = passphrase;
  passphrase_local = (string *)mnemonic;
  mnemonic_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&local_49);
  ByteData::ByteData(&this->seed_,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  ConvertMnemonicToSeed(&local_78,mnemonic,passphrase,(bool)(local_21 & 1));
  error_code = (CfdError)((ulong)&local_78 >> 0x20);
  ByteData::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ByteData::~ByteData((ByteData *)0x44081e);
  this_00 = (CfdException *)ByteData::GetDataSize(&this->seed_);
  if (this_00 != (CfdException *)0x10) {
    message = (string *)ByteData::GetDataSize(&this->seed_);
    if (message != (string *)0x20) {
      sVar1 = ByteData::GetDataSize(&this->seed_);
      if (sVar1 != 0x40) {
        uVar2 = __cxa_allocate_exception(0x30);
        paVar3 = &local_99;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_98,"Seed length error.",paVar3);
        CfdException::CfdException(this_00,error_code,message);
        __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(
    std::vector<std::string> mnemonic, std::string passphrase,
    bool use_ideographic_space)
    : seed_(ByteData(kEmptySeedStr)) {
  seed_ = ConvertMnemonicToSeed(mnemonic, passphrase, use_ideographic_space);
  if ((seed_.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed_.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed_.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}